

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlContext.cpp
# Opt level: O2

int sf::priv::GlContext::evaluateFormat
              (uint bitsPerPixel,ContextSettings *settings,int colorBits,int depthBits,
              int stencilBits,int antialiasing,bool accelerated,bool sRgb)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar2 = settings->depthBits - depthBits;
  iVar5 = settings->stencilBits - stencilBits;
  iVar1 = settings->antialiasingLevel - antialiasing;
  iVar4 = 100000;
  if ((int)(bitsPerPixel - colorBits) < 1) {
    iVar4 = 1;
  }
  iVar4 = iVar4 * (bitsPerPixel - colorBits);
  iVar3 = 100000;
  if (iVar2 < 1) {
    iVar3 = 1;
  }
  iVar3 = iVar3 * iVar2;
  iVar2 = 100000;
  if (iVar5 < 1) {
    iVar2 = 1;
  }
  iVar2 = iVar2 * iVar5;
  iVar5 = 100000;
  if (iVar1 < 1) {
    iVar5 = 1;
  }
  iVar5 = iVar5 * iVar1;
  iVar1 = -iVar4;
  if (0 < iVar4) {
    iVar1 = iVar4;
  }
  iVar4 = -iVar3;
  if (0 < iVar3) {
    iVar4 = iVar3;
  }
  iVar3 = -iVar2;
  if (0 < iVar2) {
    iVar3 = iVar2;
  }
  iVar3 = iVar3 + iVar4 + iVar1;
  iVar4 = -iVar5;
  if (0 < iVar5) {
    iVar4 = iVar5;
  }
  iVar1 = iVar3 + iVar4;
  iVar4 = iVar4 + iVar3 + 10000000;
  if (sRgb) {
    iVar4 = iVar1;
  }
  if (settings->sRgbCapable == false) {
    iVar4 = iVar1;
  }
  iVar1 = iVar4 + 100000000;
  if (accelerated) {
    iVar1 = iVar4;
  }
  return iVar1;
}

Assistant:

int GlContext::evaluateFormat(unsigned int bitsPerPixel, const ContextSettings& settings, int colorBits, int depthBits, int stencilBits, int antialiasing, bool accelerated, bool sRgb)
{
    int colorDiff        = static_cast<int>(bitsPerPixel)               - colorBits;
    int depthDiff        = static_cast<int>(settings.depthBits)         - depthBits;
    int stencilDiff      = static_cast<int>(settings.stencilBits)       - stencilBits;
    int antialiasingDiff = static_cast<int>(settings.antialiasingLevel) - antialiasing;

    // Weight sub-scores so that better settings don't score equally as bad as worse settings
    colorDiff        *= ((colorDiff        > 0) ? 100000 : 1);
    depthDiff        *= ((depthDiff        > 0) ? 100000 : 1);
    stencilDiff      *= ((stencilDiff      > 0) ? 100000 : 1);
    antialiasingDiff *= ((antialiasingDiff > 0) ? 100000 : 1);

    // Aggregate the scores
    int score = std::abs(colorDiff) + std::abs(depthDiff) + std::abs(stencilDiff) + std::abs(antialiasingDiff);

    // If the user wants an sRGB capable format, try really hard to get one
    if (settings.sRgbCapable && !sRgb)
        score += 10000000;

    // Make sure we prefer hardware acceleration over features
    if (!accelerated)
        score += 100000000;

    return score;
}